

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckFunctions.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckFunctions(Parser *this,char *regEx,unsigned_long maxLength)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  pointer pcVar8;
  pointer pcVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  size_type *psVar14;
  long *plVar15;
  byte bVar16;
  Error error;
  string functionName;
  string functionLine;
  RegularExpression regex;
  undefined1 local_398 [24];
  string local_380 [8];
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  undefined8 local_360;
  unsigned_long local_358;
  string *local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  char *local_2e8;
  string local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  RegularExpression local_260;
  
  if (regEx != (char *)0x0) {
    this->m_TestsDone[0x1e] = true;
    std::__cxx11::string::_M_replace
              ((ulong)(this->m_TestsDescription + 0x1e),0,
               (char *)this->m_TestsDescription[0x1e]._M_string_length,0x178f49);
    std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x1e));
  }
  if (maxLength != 0) {
    this->m_TestsDone[0x1f] = true;
    psVar1 = this->m_TestsDescription + 0x1f;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)this->m_TestsDescription[0x1f]._M_string_length,0x178f75);
    pcVar4 = (char *)operator_new__(0x16);
    snprintf(pcVar4,0x16,"%ld",maxLength);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    operator_delete__(pcVar4);
  }
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  if (regEx != (char *)0x0) {
    kwssys::RegularExpression::compile(&local_260,regEx);
  }
  sVar5 = FindFunction(this,0,(char *)0x0);
  if (sVar5 == 0xffffffffffffffff) {
    bVar16 = 1;
  }
  else {
    local_350 = &this->m_BufferNoComment;
    local_360 = 0;
    local_358 = maxLength;
    local_2e8 = regEx;
    do {
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
      if (0 < (long)sVar5) {
        do {
          if ((this->m_BufferNoComment)._M_dataplus._M_p[sVar5] == ')') {
            sVar5 = FindOpeningChar(this,')','(',sVar5,true);
            sVar5 = sVar5 - 1;
            goto LAB_0015bea7;
          }
          bVar3 = 1 < (long)sVar5;
          sVar5 = sVar5 - 1;
        } while (bVar3);
        sVar5 = 0;
      }
LAB_0015bea7:
      if (0 < (long)sVar5) {
        bVar3 = false;
        do {
          pcVar8 = (this->m_BufferNoComment)._M_dataplus._M_p;
          uVar13 = (ulong)(byte)pcVar8[sVar5];
          if ((uVar13 < 0x2b) && ((0x44100002600U >> (uVar13 & 0x3f) & 1) != 0)) {
            if (bVar3) goto LAB_0015bf1e;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_398,pcVar8[sVar5],&local_308);
            std::__cxx11::string::operator=((string *)&local_308,(string *)local_398);
            if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
              operator_delete((void *)local_398._0_8_);
            }
            bVar3 = true;
          }
          bVar2 = 1 < (long)sVar5;
          sVar5 = sVar5 - 1;
        } while (bVar2);
        sVar5 = 0;
      }
LAB_0015bf1e:
      lVar6 = GetLineNumber(this,sVar5,true);
      GetLine_abi_cxx11_(&local_280,this,lVar6 - 1);
      lVar6 = std::__cxx11::string::find((char *)&local_280,0x1782ba,0);
      if (lVar6 == -1) {
        lVar6 = std::__cxx11::string::find((char *)&local_280,0x178e5e,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_280,0x178e6a,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_280,0x178e74,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_308,0x16b551,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_308,0x178f91,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_308,0x178f97,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_308,0x178538,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_308,0x178533,0);
        if (lVar6 != -1) goto LAB_0015c077;
        lVar6 = std::__cxx11::string::find((char *)&local_308,0x178e27,0);
        if (lVar6 != -1) goto LAB_0015c077;
        uVar13 = std::__cxx11::string::find((char *)&local_308,0x178e52,0);
        lVar6 = std::__cxx11::string::find((char *)&local_308,0x177d62,uVar13);
        if (((uVar13 == 0xffffffffffffffff) || (lVar6 == -1)) || (lVar6 <= (long)uVar13)) {
          if (uVar13 != 0xffffffffffffffff) {
            std::__cxx11::string::substr((ulong)local_398,(ulong)&local_308);
            goto LAB_0015c62a;
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_398,(ulong)&local_308);
LAB_0015c62a:
          std::__cxx11::string::operator=((string *)&local_308,(string *)local_398);
          if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
            operator_delete((void *)local_398._0_8_);
          }
        }
      }
      else {
LAB_0015c077:
        std::__cxx11::string::_M_replace
                  ((ulong)&local_308,0,(char *)local_308._M_string_length,0x16b513);
      }
      if ((char *)local_308._M_string_length == (char *)0x0) {
        sVar5 = std::__cxx11::string::find((char)local_350,0x7b);
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
        sVar5 = FindClosingChar(this,'{','}',sVar5,true,&local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        sVar5 = FindFunction(this,sVar5 + 1,(char *)0x0);
      }
      else {
        sVar5 = std::__cxx11::string::find((char)local_350,0x7b);
        sVar7 = GetPositionWithComments(this,sVar5);
        pcVar8 = (pointer)GetLineNumber(this,sVar7,false);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
        sVar7 = FindClosingChar(this,'{','}',sVar5,true,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        sVar5 = GetPositionWithComments(this,sVar7);
        pcVar9 = (pointer)GetLineNumber(this,sVar5,false);
        sVar5 = FindFunction(this,sVar7 + 1,(char *)0x0);
        if ((long)sVar5 < (long)sVar7) {
          sVar5 = std::__cxx11::string::find((char)local_350,0x7b);
          sVar5 = FindFunction(this,sVar5,(char *)0x0);
        }
        bVar3 = kwssys::RegularExpression::find
                          (&local_260,local_308._M_dataplus._M_p,&local_260.regmatch);
        if (!bVar3) {
          local_380 = (string  [8])&local_370;
          local_378 = 0;
          local_370._M_local_buf[0] = '\0';
          local_398._16_8_ = 0x1e;
          local_398._0_8_ = pcVar8;
          local_398._8_8_ = pcVar8;
          std::operator+(&local_2a0,"function (",&local_308);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_2a0);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_348.field_2._M_allocated_capacity = *psVar14;
            local_348.field_2._8_8_ = plVar10[3];
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar14;
            local_348._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_348._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_348);
          plVar15 = plVar10 + 2;
          if ((long *)*plVar10 == plVar15) {
            local_318 = *plVar15;
            lStack_310 = plVar10[3];
            local_328 = &local_318;
          }
          else {
            local_318 = *plVar15;
            local_328 = (long *)*plVar10;
          }
          local_320 = plVar10[1];
          *plVar10 = (long)plVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=(local_380,(string *)&local_328);
          if (local_328 != &local_318) {
            operator_delete(local_328);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,(value_type *)local_398);
          paVar12 = &local_370;
          if (local_380 != (string  [8])paVar12) {
            operator_delete((void *)local_380);
            paVar12 = extraout_RAX;
          }
          local_360 = CONCAT71((int7)((ulong)paVar12 >> 8),1);
        }
        if (((local_358 != 0) && (-1 < (long)((ulong)pcVar9 | (ulong)pcVar8))) &&
           ((long)local_358 < (long)pcVar9 - (long)pcVar8)) {
          local_380 = (string  [8])&local_370;
          local_378 = 0;
          local_370._M_local_buf[0] = '\0';
          local_398._16_8_ = 0x1f;
          local_398._0_8_ = pcVar8;
          local_398._8_8_ = pcVar9;
          std::operator+(&local_348,"function (",&local_308);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
          plVar10 = puVar11 + 2;
          if ((long *)*puVar11 == plVar10) {
            local_318 = *plVar10;
            lStack_310 = puVar11[3];
            local_328 = &local_318;
          }
          else {
            local_318 = *plVar10;
            local_328 = (long *)*puVar11;
          }
          local_320 = puVar11[1];
          *puVar11 = plVar10;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=(local_380,(string *)&local_328);
          if (local_328 != &local_318) {
            operator_delete(local_328);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          pcVar4 = (char *)operator_new__(0x16);
          snprintf(pcVar4,0x16,"%ld",(long)pcVar9 - (long)pcVar8);
          std::__cxx11::string::append((char *)local_380);
          std::__cxx11::string::append((char *)local_380);
          snprintf(pcVar4,0x16,"%ld",local_358);
          std::__cxx11::string::append((char *)local_380);
          std::__cxx11::string::append((char *)local_380);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,(value_type *)local_398);
          operator_delete__(pcVar4);
          paVar12 = &local_370;
          if (local_380 != (string  [8])paVar12) {
            operator_delete((void *)local_380);
            paVar12 = extraout_RAX_00;
          }
          local_360 = CONCAT71((int7)((ulong)paVar12 >> 8),1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
    } while (sVar5 != 0xffffffffffffffff);
    bVar16 = (byte)local_360 ^ 1;
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return (bool)(bVar16 & 1);
}

Assistant:

bool Parser::CheckFunctions(const char* regEx,unsigned long maxLength)
{
  if(regEx)
    {
    m_TestsDone[FUNCTION_REGEX] = true;
    m_TestsDescription[FUNCTION_REGEX] = "Functions should match regular expression: ";
    m_TestsDescription[FUNCTION_REGEX] += regEx;
    }

  if(maxLength>0)
    {
    m_TestsDone[FUNCTION_LENGTH] = true;
    m_TestsDescription[FUNCTION_LENGTH] = "Functions must not exceed: ";
    constexpr size_t length = 22;
    char* temp = new char[length];
    snprintf(temp,length,"%ld",maxLength);
    m_TestsDescription[FUNCTION_LENGTH] += temp;
    m_TestsDescription[FUNCTION_LENGTH] += " lines";
    delete [] temp;
    }

  // First we need to find the parameters
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  // List all the function in the file
  auto pos = static_cast<long int>(this->FindFunction(0));
  while(pos != -1)
    {
    // We extract the name of the function
    std::string functionName = "";
    // Find the ) and the openning (
    long int i=pos;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] == ')')
        {
        i = static_cast<long int>(this->FindOpeningChar(')','(',i,true));
        i--;
        break;
        }
      }

    bool inWord = false;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\t'
         && m_BufferNoComment[i] != '\r' && m_BufferNoComment[i] != '\n'
         && m_BufferNoComment[i] != '*' && m_BufferNoComment[i] != '&')
        {
        inWord = true;
        functionName = m_BufferNoComment[i]+functionName;
        }
      else if(inWord)
        {
        break;
        }
      }

    // Check that this is not a #define (tricky)
    std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);

    if(functionLine.find("#define") == std::string::npos
       && functionLine.find("_attribute_") == std::string::npos
       && functionLine.find(" operator") == std::string::npos
       && functionLine.find("friend ") == std::string::npos
       && functionName.find("if") == std::string::npos
       && functionName.find("while") == std::string::npos
       && functionName.find("for") == std::string::npos
       && functionName.find("switch") == std::string::npos
       && functionName.find("main") == std::string::npos
       && functionName.find("~") == std::string::npos // skip destructor for now...
       )
      {
      auto posf = static_cast<long int>(functionName.find("::", 0));
      auto posp = static_cast<long int>(functionName.find("(", posf));
      if(posp != -1 && posf != -1 && posp>posf)
        {
        functionName = functionName.substr(posf+2,posp-posf-2);
        }
      else if(posf != -1)
        {
        functionName = functionName.substr(posf+2,functionName.size()-posf-2);
        }
      }
    else
      {
      functionName = "";
      }

    //std::cout << "Function Name = " << functionName.c_str() << std::endl;

      if (functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        /*if(pos2 > pos)
          {
          long int bf = m_BufferNoComment.find('{',pos2);
          pos = this->FindFunction(bf);
          }*/
        continue;
      } else if (!functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        auto bfcomments = static_cast<long int>(GetPositionWithComments(bf));
        auto bfl = static_cast<long int>(this->GetLineNumber(bfcomments));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        auto poscomments = static_cast<long int>(GetPositionWithComments(pos2));
        long int efl = this->GetLineNumber(poscomments);

        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        if (pos2 > pos) {
          auto localbf =
              static_cast<long int>(m_BufferNoComment.find('{', pos2));
          pos = static_cast<long int>(this->FindFunction(localbf));
        }

      if(!regex.find(functionName))
        {
        Error error;
        error.line = bfl;
        error.line2 = error.line;
        error.number = FUNCTION_REGEX;
        error.description = "function (" + functionName + ") doesn't match regular expression: " + regEx;
        m_ErrorList.push_back(error);
        hasError = true;
        }

      if(maxLength>0)
        {
        if((bfl>-1) && (efl>-1) && (efl-bfl>(long int)maxLength))
          {
          Error error;
          error.line = bfl;
          error.line2 = efl;
          error.number = FUNCTION_LENGTH;
          error.description = "function (" + functionName + ") has too many lines: ";
          constexpr size_t length = 22;
          char* temp = new char[length];
          snprintf(temp,length,"%ld",efl-bfl);
          error.description += temp;
          error.description += " (";
          snprintf(temp,length,"%ld",maxLength);
          error.description += temp;
          error.description += ")";
          m_ErrorList.push_back(error);
          hasError = true;
          delete [] temp;
          }
        }
      }
    }

  return !hasError;
}